

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O1

double __thiscall
fasttext::Autotune::getMetricScore
          (Autotune *this,Meter *meter,metric_name *metricName,string *metricLabel)

{
  int32_t iVar1;
  int32_t iVar2;
  runtime_error *this_00;
  double dVar3;
  Dictionary *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*metricName == labelf1score) {
    FastText::getDictionary
              ((this->fastText_).super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    iVar1 = Dictionary::getId(local_38,metricLabel);
    if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
    }
    if (iVar1 != -1) {
      FastText::getDictionary
                ((this->fastText_).
                 super___shared_ptr<fasttext::FastText,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar2 = Dictionary::nwords(local_38);
      if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
      }
      dVar3 = Meter::f1Score(meter,iVar1 - iVar2);
      return dVar3;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown autotune metric label");
  }
  else {
    if (*metricName == f1score) {
      dVar3 = Meter::f1Score(meter);
      return dVar3;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unknown metric");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

double Autotune::getMetricScore(
    Meter& meter,
    const metric_name& metricName,
    const std::string& metricLabel) const {
  double score = 0.0;
  if (metricName == metric_name::f1score) {
    score = meter.f1Score();
  } else if (metricName == metric_name::labelf1score) {
    int32_t labelId = fastText_->getDictionary()->getId(metricLabel);
    if (labelId == -1) {
      throw std::runtime_error("Unknown autotune metric label");
    }
    labelId = labelId - fastText_->getDictionary()->nwords();
    score = meter.f1Score(labelId);
  } else {
    throw std::runtime_error("Unknown metric");
  }
  return score;
}